

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

Maybe<const_kj::Exception_&> __thiscall
kj::InFlightExceptionIterator::next(InFlightExceptionIterator *this)

{
  Exception *pEVar1;
  char *pcVar2;
  long *in_RSI;
  
  pEVar1 = (Exception *)*in_RSI;
  if (pEVar1 != (Exception *)0x0) {
    anon_unknown_70::validateExceptionPointer((ExceptionImpl *)&pEVar1[-1].details.builder.disposer)
    ;
    pcVar2 = pEVar1[1].file;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = pcVar2 + 8;
    }
    *in_RSI = (long)pcVar2;
  }
  this->ptr = pEVar1;
  return (Maybe<const_kj::Exception_&>)(Exception *)this;
}

Assistant:

Maybe<const Exception&> InFlightExceptionIterator::next() {
  if (ptr == nullptr) return kj::none;

  const ExceptionImpl* result = static_cast<const ExceptionImpl*>(ptr);
  validateExceptionPointer(result);
  ptr = result->nextCurrentException;
  return *result;
}